

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

char * __thiscall cmMakefile::GetRequiredDefinition(cmMakefile *this,string *name)

{
  char *pcVar1;
  
  pcVar1 = GetDefinition(this,name);
  if (pcVar1 == (char *)0x0) {
    cmSystemTools::Error
              ("Error required internal CMake variable not set, cmake may not be built correctly.\n"
               ,"Missing variable is:\n",(name->_M_dataplus)._M_p,(char *)0x0);
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char* cmMakefile::GetRequiredDefinition(const std::string& name) const
{
  const char* ret = this->GetDefinition(name);
  if (!ret) {
    cmSystemTools::Error("Error required internal CMake variable not "
                         "set, cmake may not be built correctly.\n",
                         "Missing variable is:\n", name.c_str());
    return "";
  }
  return ret;
}